

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O2

void __thiscall icu_63::RBBISetBuilder::mergeCategories(RBBISetBuilder *this,IntPair categories)

{
  RangeDescriptor *pRVar1;
  RangeDescriptor **ppRVar2;
  uint uVar3;
  
  ppRVar2 = &this->fRangeList;
  do {
    pRVar1 = *ppRVar2;
    if (pRVar1 == (RangeDescriptor *)0x0) {
      this->fGroupCount = this->fGroupCount + -1;
      return;
    }
    uVar3 = pRVar1->fNum;
    if ((uVar3 & 0xffffbfff) == categories.second) {
      uVar3 = uVar3 & 0x4000 | categories.first;
LAB_00293cdb:
      pRVar1->fNum = uVar3;
    }
    else if (categories.second < (int)(uVar3 & 0xffffbfff)) {
      uVar3 = uVar3 - 1;
      goto LAB_00293cdb;
    }
    ppRVar2 = &pRVar1->fNext;
  } while( true );
}

Assistant:

void RBBISetBuilder::mergeCategories(IntPair categories) {
    U_ASSERT(categories.first >= 1);
    U_ASSERT(categories.second > categories.first);
    for (RangeDescriptor *rd = fRangeList; rd != nullptr; rd = rd->fNext) {
        int32_t rangeNum = rd->fNum & ~DICT_BIT;
        int32_t rangeDict = rd->fNum & DICT_BIT;
        if (rangeNum == categories.second) {
            rd->fNum = categories.first | rangeDict;
        } else if (rangeNum > categories.second) {
            rd->fNum--;
        }
    }
    --fGroupCount;
}